

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

void slang::ast::RandSeqProductionSymbol::createRuleVariables
               (RsRuleSyntax *syntax,Scope *scope,
               SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  char_pointer puVar1;
  RandSeqProductionSymbol *pRVar2;
  uint uVar3;
  DeferredSourceRange sourceRange;
  VariableSymbol *pVVar4;
  Type *pTVar5;
  char_pointer puVar6;
  uint uVar7;
  DeclaredType *this;
  char_pointer puVar8;
  RsIfElseSyntax *ries;
  table_element_pointer ppVar9;
  undefined1 auVar10 [16];
  iterator iVar11;
  anon_class_16_2_7e13625a countProd;
  SmallMap<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int,_8UL,_std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
  prodMap;
  VariableLifetime local_15c;
  Scope *local_158;
  Compilation *local_150;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_148;
  Token local_140;
  SourceLocation local_130;
  Scope *local_128;
  Storage *local_120;
  undefined1 local_118 [16];
  RsRuleSyntax *local_108;
  undefined1 local_f8 [128];
  Storage *local_78;
  undefined1 local_70 [40];
  size_t local_48;
  size_t local_40;
  
  local_120 = (Storage *)local_f8;
  local_70._8_8_ = 0x3f;
  local_70._16_8_ = 1;
  local_70._24_16_ = ZEXT816(0x47fac0);
  local_48 = 0;
  local_40 = 0;
  local_158 = scope;
  local_148 = results;
  local_128 = scope;
  local_78 = local_120;
  local_70._0_8_ = local_120;
  if ((syntax->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>._M_extent.
      _M_extent_value != 0) {
    (*(code *)(&DAT_00484cc4 +
              *(int *)(&DAT_00484cc4 +
                      (ulong)(((*(syntax->prods).
                                 super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>.
                                 _M_ptr)->super_SyntaxNode).kind - RsCase) * 4)))();
    return;
  }
  local_150 = scope->compilation;
  iVar11 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_slang::hash<const_slang::ast::RandSeqProductionSymbol_*,_void>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
           ::begin((table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_slang::hash<const_slang::ast::RandSeqProductionSymbol_*,_void>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
                    *)local_70);
  if (iVar11.p_ == (table_element_pointer)0x0) {
LAB_0020a901:
    boost::unordered::detail::foa::
    table_arrays<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
    ::delete_((allocator_type)local_70._0_8_,
              (table_arrays<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::RandSeqProductionSymbol_*const,_unsigned_int>,_128UL,_16UL>_>
               *)(local_70 + 8));
    return;
  }
LAB_0020a7a6:
  pRVar2 = (iVar11.p_)->first;
  uVar7 = (iVar11.p_)->second;
  local_140 = slang::syntax::SyntaxNode::getFirstToken(&syntax->super_SyntaxNode);
  local_130 = parsing::Token::location(&local_140);
  local_15c = Automatic;
  pVVar4 = BumpAllocator::
           emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation,slang::ast::VariableLifetime>
                     (&local_150->super_BumpAllocator,&(pRVar2->super_Symbol).name,&local_130,
                      &local_15c);
  *(byte *)&(pVVar4->flags).m_bits = (byte)(pVVar4->flags).m_bits | 3;
  this = &pRVar2->declaredReturnType;
  if (uVar7 == 1) {
    pTVar5 = DeclaredType::getType(this);
  }
  else {
    pTVar5 = DeclaredType::getType(this);
    local_118 = (undefined1  [16])0x0;
    sourceRange.node.value = (uintptr_t)syntax;
    sourceRange.range = (SourceRange)ZEXT816(0);
    local_108 = syntax;
    pTVar5 = FixedSizeUnpackedArrayType::fromDim
                       (local_158,pTVar5,(ConstantRange)(((ulong)uVar7 << 0x20) + 1),sourceRange);
  }
  (pVVar4->super_ValueSymbol).declaredType.type = pTVar5;
  local_140._0_8_ = pVVar4;
  SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
            ((SmallVectorBase<slang::ast::Symbol_const*> *)local_148,(Symbol **)&local_140);
  puVar6 = iVar11.pc_ + 2;
  do {
    puVar8 = puVar6;
    puVar6 = iVar11.pc_;
    ppVar9 = iVar11.p_ + 1;
    if (((uint)iVar11.pc_ & 0xf) == 0xe) goto LAB_0020a8ac;
    puVar1 = puVar8 + -1;
    iVar11.p_ = ppVar9;
    iVar11.pc_ = puVar6 + 1;
    puVar6 = puVar8 + 1;
  } while (*puVar1 == '\0');
  puVar8 = puVar8 + -1;
  if (*puVar1 == '\x01') {
    ppVar9 = (table_element_pointer)0x0;
  }
  goto LAB_0020a89c;
LAB_0020a8ac:
  do {
    auVar10[0] = -(*puVar8 == '\0');
    auVar10[1] = -(puVar8[1] == '\0');
    auVar10[2] = -(puVar8[2] == '\0');
    auVar10[3] = -(puVar8[3] == '\0');
    auVar10[4] = -(puVar8[4] == '\0');
    auVar10[5] = -(puVar8[5] == '\0');
    auVar10[6] = -(puVar8[6] == '\0');
    auVar10[7] = -(puVar8[7] == '\0');
    auVar10[8] = -(puVar8[8] == '\0');
    auVar10[9] = -(puVar8[9] == '\0');
    auVar10[10] = -(puVar8[10] == '\0');
    auVar10[0xb] = -(puVar8[0xb] == '\0');
    auVar10[0xc] = -(puVar8[0xc] == '\0');
    auVar10[0xd] = -(puVar8[0xd] == '\0');
    auVar10[0xe] = -(puVar8[0xe] == '\0');
    auVar10[0xf] = -(puVar8[0xf] == '\0');
    uVar7 = (uint)(ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe);
    if (uVar7 == 0x7fff) {
      puVar8 = puVar8 + 0x10;
      ppVar9 = ppVar9 + 0xf;
    }
    else {
      uVar3 = 0;
      if ((uVar7 ^ 0x7fff) != 0) {
        for (; ((uVar7 ^ 0x7fff) >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      if (puVar8[uVar3] == '\x01') {
        ppVar9 = (table_element_pointer)0x0;
      }
      else {
        puVar8 = puVar8 + uVar3;
        ppVar9 = (table_element_pointer)((long)&ppVar9->first + (ulong)(uVar3 << 4));
      }
    }
  } while (uVar7 == 0x7fff);
LAB_0020a89c:
  iVar11.p_ = ppVar9;
  iVar11.pc_ = puVar8;
  if (ppVar9 == (table_element_pointer)0x0) goto LAB_0020a901;
  goto LAB_0020a7a6;
}

Assistant:

void RandSeqProductionSymbol::createRuleVariables(const RsRuleSyntax& syntax, const Scope& scope,
                                                  SmallVectorBase<const Symbol*>& results) {
    SmallMap<const RandSeqProductionSymbol*, uint32_t, 8> prodMap;
    auto countProd = [&](const RsProdItemSyntax& item) {
        auto symbol = Lookup::unqualified(scope, item.name.valueText(),
                                          LookupFlags::AllowDeclaredAfter);
        if (symbol && symbol->kind == SymbolKind::RandSeqProduction) {
            auto& prod = symbol->as<RandSeqProductionSymbol>();
            auto& type = prod.getReturnType();
            if (!type.isVoid()) {
                auto [it, inserted] = prodMap.emplace(&prod, 1);
                if (!inserted)
                    it->second++;
            }
        }
    };

    for (auto p : syntax.prods) {
        switch (p->kind) {
            case SyntaxKind::RsProdItem:
                countProd(p->as<RsProdItemSyntax>());
                break;
            case SyntaxKind::RsCodeBlock:
                break;
            case SyntaxKind::RsIfElse: {
                auto& ries = p->as<RsIfElseSyntax>();
                countProd(*ries.ifItem);
                if (ries.elseClause)
                    countProd(*ries.elseClause->item);
                break;
            }
            case SyntaxKind::RsRepeat:
                countProd(*p->as<RsRepeatSyntax>().item);
                break;
            case SyntaxKind::RsCase:
                for (auto item : p->as<RsCaseSyntax>().items) {
                    switch (item->kind) {
                        case SyntaxKind::StandardRsCaseItem:
                            countProd(*item->as<StandardRsCaseItemSyntax>().item);
                            break;
                        case SyntaxKind::DefaultRsCaseItem:
                            countProd(*item->as<DefaultRsCaseItemSyntax>().item);
                            break;
                        default:
                            SLANG_UNREACHABLE;
                    }
                }
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    auto& comp = scope.getCompilation();
    for (auto [symbol, count] : prodMap) {
        auto var = comp.emplace<VariableSymbol>(symbol->name, syntax.getFirstToken().location(),
                                                VariableLifetime::Automatic);
        var->flags |= VariableFlags::Const | VariableFlags::CompilerGenerated;

        if (count == 1) {
            var->setType(symbol->getReturnType());
        }
        else {
            ConstantRange range{1, int32_t(count)};
            var->setType(
                FixedSizeUnpackedArrayType::fromDim(scope, symbol->getReturnType(), range, syntax));
        }

        results.push_back(var);
    }
}